

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsLongStressCase.cpp
# Opt level: O1

void __thiscall
deqp::gls::LongStressCaseInternal::GLObjectManager<deqp::gls::LongStressCaseInternal::Buffer>::make
          (GLObjectManager<deqp::gls::LongStressCaseInternal::Buffer> *this,string *name)

{
  deInt32 *pdVar1;
  SharedPtrStateBase *pSVar2;
  Buffer *pBVar3;
  SharedPtrStateBase *pSVar4;
  mapped_type *pmVar5;
  deUint32 buf;
  GLuint local_1c;
  
  pBVar3 = (Buffer *)operator_new(8);
  local_1c = 0;
  glwGenBuffers(1,&local_1c);
  pBVar3->m_bufferGL = local_1c;
  pBVar3->m_dataSizeApprox = 0;
  pSVar4 = (SharedPtrStateBase *)operator_new(0x20);
  pSVar4->strongRefCount = 0;
  pSVar4->weakRefCount = 0;
  pSVar4->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_021c1848;
  pSVar4[1]._vptr_SharedPtrStateBase = (_func_int **)pBVar3;
  pSVar4->strongRefCount = 1;
  pSVar4->weakRefCount = 1;
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<deqp::gls::LongStressCaseInternal::Buffer>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<deqp::gls::LongStressCaseInternal::Buffer>_>_>_>
           ::operator[](&this->m_objects,name);
  pSVar2 = pmVar5->m_state;
  if (pSVar2 != pSVar4) {
    if (pSVar2 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar1 = &pSVar2->strongRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        pmVar5->m_ptr = (Buffer *)0x0;
        (*pmVar5->m_state->_vptr_SharedPtrStateBase[2])();
      }
      LOCK();
      pdVar1 = &pmVar5->m_state->weakRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        if (pmVar5->m_state != (SharedPtrStateBase *)0x0) {
          (*pmVar5->m_state->_vptr_SharedPtrStateBase[1])();
        }
        pmVar5->m_state = (SharedPtrStateBase *)0x0;
      }
    }
    pmVar5->m_ptr = pBVar3;
    pmVar5->m_state = pSVar4;
    if (pSVar4 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pSVar4->strongRefCount = pSVar4->strongRefCount + 1;
      UNLOCK();
      LOCK();
      pdVar1 = &pmVar5->m_state->weakRefCount;
      *pdVar1 = *pdVar1 + 1;
      UNLOCK();
    }
  }
  if (pSVar4 != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &pSVar4->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      (*pSVar4->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar1 = &pSVar4->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if ((*pdVar1 == 0) && (pSVar4 != (SharedPtrStateBase *)0x0)) {
      (*pSVar4->_vptr_SharedPtrStateBase[1])();
    }
  }
  return;
}

Assistant:

void						make						(const string& name)								{ DE_ASSERT(!has(name)); m_objects[name] = SharedPtr<T>(new T); }